

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O1

number_validator<long> __thiscall goodform::sub_form::int64(sub_form *this)

{
  bool bVar1;
  long extraout_RDX;
  long extraout_RDX_00;
  long extraout_RDX_01;
  long extraout_RDX_02;
  long lVar2;
  undefined8 *in_RSI;
  number_validator<long> nVar3;
  int64_t val;
  any *local_68;
  string local_60;
  error_message local_40;
  
  bVar1 = convert<long>((any *)in_RSI[1],(long *)&local_68);
  lVar2 = extraout_RDX;
  if (!bVar1) {
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"NOT A int64_t","");
    error_message::error_message(&local_40,&local_60);
    std::__cxx11::string::operator=((string *)*in_RSI,(string *)&local_40);
    lVar2 = extraout_RDX_00;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40.message_._M_dataplus._M_p != &local_40.message_.field_2) {
      operator_delete(local_40.message_._M_dataplus._M_p,
                      local_40.message_.field_2._M_allocated_capacity + 1);
      lVar2 = extraout_RDX_01;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      lVar2 = extraout_RDX_02;
    }
  }
  this->error_ = (error_message *)*in_RSI;
  this->variant_ = local_68;
  nVar3.value_ = lVar2;
  nVar3.error_ = (error_message *)this;
  return nVar3;
}

Assistant:

number_validator<std::int64_t> sub_form::int64()
  {
    std::int64_t val;
    if (!convert(this->variant_, val))
      this->error_ = error_message("NOT A int64_t");
    return number_validator<std::int64_t>(val, this->error_);
  }